

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void av1_foreach_rest_unit_in_row
               (RestorationTileLimits *limits,int plane_w,rest_unit_visitor_t on_rest_unit,
               int row_number,int unit_size,int hnum_rest_units,int vnum_rest_units,int plane,
               void *priv,int32_t *tmpbuf,RestorationLineBuffers *rlbs,sync_read_fn_t on_sync_read,
               sync_write_fn_t on_sync_write,AV1LrSyncData *lr_sync,
               aom_internal_error_info *error_info)

{
  int iVar1;
  int in_ECX;
  code *in_RDX;
  int in_ESI;
  int *in_RDI;
  int iVar2;
  RestorationLineBuffers *in_R8;
  int iVar3;
  aom_internal_error_info *in_R9;
  int in_stack_00000008;
  _Bool lr_mt_exit;
  int unit_idx;
  int w;
  int remaining_w;
  int j;
  int x0;
  int ext_size;
  undefined4 in_stack_00000038;
  aom_internal_error_info *in_stack_00000048;
  int local_44;
  uint local_30;
  int local_2c;
  
  iVar2 = (int)in_R8;
  iVar3 = (int)in_R9;
  local_2c = 0;
  local_30 = 0;
  do {
    if (in_ESI <= local_2c) {
      return;
    }
    local_44 = iVar2;
    if (in_ESI - local_2c < (iVar2 * 3) / 2) {
      local_44 = in_ESI - local_2c;
    }
    *in_RDI = local_2c;
    in_RDI[1] = local_2c + local_44;
    (*on_rest_unit)(limits,in_ECX,(void *)(ulong)local_30,(int32_t *)(ulong)(uint)w,in_R8,in_R9);
    if (in_ECX + 1 < in_stack_00000008) {
      (*on_rest_unit)(limits,in_ECX + 2,(void *)(ulong)local_30,(int32_t *)(ulong)(uint)w,in_R8,
                      in_R9);
    }
    if ((limits != (RestorationTileLimits *)0x0) && (1 < limits[5].h_end)) {
      pthread_mutex_lock(*(pthread_mutex_t **)&limits[5].v_start);
      iVar1 = limits[7].v_start;
      pthread_mutex_unlock(*(pthread_mutex_t **)&limits[5].v_start);
      if ((iVar1 & 1) != 0) {
        return;
      }
    }
    in_R9 = in_stack_00000048;
    (*in_RDX)(in_RDI,in_ECX * iVar3 + local_30,_j,CONCAT44(hnum_rest_units,ext_size),
              CONCAT44(row_number,unit_size));
    in_R8 = (RestorationLineBuffers *)(ulong)(uint)w;
    (*(code *)CONCAT44(plane_w,in_stack_00000038))(limits,in_ECX,local_30,iVar3);
    local_2c = local_44 + local_2c;
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void av1_foreach_rest_unit_in_row(
    RestorationTileLimits *limits, int plane_w,
    rest_unit_visitor_t on_rest_unit, int row_number, int unit_size,
    int hnum_rest_units, int vnum_rest_units, int plane, void *priv,
    int32_t *tmpbuf, RestorationLineBuffers *rlbs, sync_read_fn_t on_sync_read,
    sync_write_fn_t on_sync_write, struct AV1LrSyncData *const lr_sync,
    struct aom_internal_error_info *error_info) {
  const int ext_size = unit_size * 3 / 2;
  int x0 = 0, j = 0;
  while (x0 < plane_w) {
    int remaining_w = plane_w - x0;
    int w = (remaining_w < ext_size) ? remaining_w : unit_size;

    limits->h_start = x0;
    limits->h_end = x0 + w;
    assert(limits->h_end <= plane_w);

    const int unit_idx = row_number * hnum_rest_units + j;

    // No sync for even numbered rows
    // For odd numbered rows, Loop Restoration of current block requires the LR
    // of top-right and bottom-right blocks to be completed

    // top-right sync
    on_sync_read(lr_sync, row_number, j, plane);
    if ((row_number + 1) < vnum_rest_units)
      // bottom-right sync
      on_sync_read(lr_sync, row_number + 2, j, plane);

#if CONFIG_MULTITHREAD
    if (lr_sync && lr_sync->num_workers > 1) {
      pthread_mutex_lock(lr_sync->job_mutex);
      const bool lr_mt_exit = lr_sync->lr_mt_exit;
      pthread_mutex_unlock(lr_sync->job_mutex);
      // Exit in case any worker has encountered an error.
      if (lr_mt_exit) return;
    }
#endif

    on_rest_unit(limits, unit_idx, priv, tmpbuf, rlbs, error_info);

    on_sync_write(lr_sync, row_number, j, hnum_rest_units, plane);

    x0 += w;
    ++j;
  }
}